

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_active.cc
# Opt level: O2

base_learner * cs_active_setup(options_i *options,vw *all)

{
  bool bVar1;
  int iVar2;
  option_group_definition *poVar3;
  typed_option<int> *op;
  typed_option<float> *ptVar4;
  typed_option<unsigned_long> *ptVar5;
  ostream *poVar6;
  base_learner *pbVar7;
  learner<char,_example> *base;
  learner<cs_active,_example> *plVar8;
  vw_exception *pvVar9;
  long lVar10;
  code *predict;
  code *learn;
  uint32_t i;
  uint uVar11;
  undefined **ppuVar12;
  label_parser *plVar13;
  byte bVar14;
  bool simulation;
  free_ptr<cs_active> data;
  allocator local_bc2;
  allocator local_bc1;
  allocator local_bc0;
  allocator local_bbf;
  allocator local_bbe;
  allocator local_bbd;
  allocator local_bbc;
  allocator local_bbb;
  allocator local_bba;
  allocator local_bb9;
  allocator local_bb8;
  allocator local_bb7;
  allocator local_bb6;
  allocator local_bb5;
  allocator local_bb4;
  allocator local_bb3;
  allocator local_bb2;
  allocator local_bb1;
  allocator local_bb0;
  allocator local_baf;
  allocator local_bae;
  allocator local_bad;
  int domination;
  stringstream __msg;
  undefined1 local_b98 [96];
  bool local_b38;
  string local_a20 [32];
  string local_a00;
  string local_9e0 [32];
  string local_9c0;
  string local_9a0 [32];
  string local_980;
  string local_960 [32];
  string local_940;
  string local_920 [32];
  string local_900;
  string local_8e0 [32];
  string local_8c0;
  string local_8a0 [32];
  string local_880;
  string local_860 [32];
  string local_840;
  string local_820 [32];
  string local_800;
  string local_7e0 [32];
  string local_7c0;
  string local_7a0 [32];
  string local_780;
  string local_760;
  string local_740;
  string local_720;
  string local_700;
  string local_6e0;
  string local_6c0;
  option_group_definition new_options;
  string loss_function_type;
  string local_638 [112];
  undefined1 local_5c8 [160];
  undefined1 local_528 [160];
  typed_option<float> local_488;
  typed_option<float> local_3e8;
  typed_option<unsigned_long> local_348;
  typed_option<unsigned_long> local_2a8;
  typed_option<float> local_208;
  typed_option<float> local_168;
  typed_option<int> local_c8;
  
  bVar14 = 0;
  scoped_calloc_or_throw<cs_active>();
  simulation = false;
  std::__cxx11::string::string
            ((string *)&local_760,"Cost-sensitive Active Learning",(allocator *)&__msg);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_760);
  std::__cxx11::string::~string((string *)&local_760);
  std::__cxx11::string::string((string *)&local_780,"cs_active",&local_bad);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)&__msg,&local_780,
             &(data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_cs_active_*,_false>._M_head_impl)->num_classes);
  local_b38 = true;
  std::__cxx11::string::string(local_7a0,"Cost-sensitive active learning with <k> costs",&local_bae)
  ;
  std::__cxx11::string::_M_assign((string *)(local_b98 + 0x20));
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (&new_options,(typed_option<unsigned_int> *)&__msg);
  std::__cxx11::string::string((string *)&local_7c0,"simulation",&local_baf);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)&loss_function_type,&local_7c0,&simulation);
  std::__cxx11::string::string
            (local_7e0,"cost-sensitive active learning simulation mode",&local_bb0);
  std::__cxx11::string::_M_assign(local_638);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar3,(typed_option<bool> *)&loss_function_type);
  std::__cxx11::string::string((string *)&local_800,"baseline",&local_bb1);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_5c8,&local_800,
             &(data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_cs_active_*,_false>._M_head_impl)->is_baseline);
  std::__cxx11::string::string(local_820,"cost-sensitive active learning baseline",&local_bb2);
  std::__cxx11::string::_M_assign((string *)(local_5c8 + 0x30));
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar3,(typed_option<bool> *)local_5c8);
  std::__cxx11::string::string((string *)&local_840,"domination",&local_bb3);
  VW::config::typed_option<int>::typed_option(&local_c8,&local_840,&domination);
  op = VW::config::typed_option<int>::default_value(&local_c8,1);
  std::__cxx11::string::string
            (local_860,"cost-sensitive active learning use domination. Default 1",&local_bb4);
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<int>&>(poVar3,op);
  std::__cxx11::string::string((string *)&local_880,"mellowness",&local_bb5);
  VW::config::typed_option<float>::typed_option
            (&local_168,&local_880,
             &(data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_cs_active_*,_false>._M_head_impl)->c0);
  ptVar4 = VW::config::typed_option<float>::default_value(&local_168,0.1);
  std::__cxx11::string::string(local_8a0,"mellowness parameter c_0. Default 0.1.",&local_bb6);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar3,ptVar4)
  ;
  std::__cxx11::string::string((string *)&local_8c0,"range_c",&local_bb7);
  VW::config::typed_option<float>::typed_option
            (&local_208,&local_8c0,
             &(data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_cs_active_*,_false>._M_head_impl)->c1);
  ptVar4 = VW::config::typed_option<float>::default_value(&local_208,0.5);
  std::__cxx11::string::string
            (local_8e0,
             "parameter controlling the threshold for per-label cost uncertainty. Default 0.5.",
             &local_bb8);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar3,ptVar4)
  ;
  std::__cxx11::string::string((string *)&local_900,"max_labels",&local_bb9);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_2a8,&local_900,
             &(data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_cs_active_*,_false>._M_head_impl)->max_labels);
  ptVar5 = VW::config::typed_option<unsigned_long>::default_value(&local_2a8,0xffffffffffffffff);
  std::__cxx11::string::string(local_920,"maximum number of label queries.",&local_bba);
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar3,ptVar5);
  std::__cxx11::string::string((string *)&local_940,"min_labels",&local_bbb);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_348,&local_940,
             &(data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_cs_active_*,_false>._M_head_impl)->min_labels);
  ptVar5 = VW::config::typed_option<unsigned_long>::default_value(&local_348,0xffffffffffffffff);
  std::__cxx11::string::string(local_960,"minimum number of label queries.",&local_bbc);
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar3,ptVar5);
  std::__cxx11::string::string((string *)&local_980,"cost_max",&local_bbd);
  VW::config::typed_option<float>::typed_option
            (&local_3e8,&local_980,
             &(data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_cs_active_*,_false>._M_head_impl)->cost_max);
  ptVar4 = VW::config::typed_option<float>::default_value(&local_3e8,1.0);
  std::__cxx11::string::string(local_9a0,"cost upper bound. Default 1.",&local_bbe);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar3,ptVar4)
  ;
  std::__cxx11::string::string((string *)&local_9c0,"cost_min",&local_bbf);
  VW::config::typed_option<float>::typed_option
            (&local_488,&local_9c0,
             &(data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_cs_active_*,_false>._M_head_impl)->cost_min);
  ptVar4 = VW::config::typed_option<float>::default_value(&local_488,0.0);
  std::__cxx11::string::string(local_9e0,"cost lower bound. Default 0.",&local_bc0);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar3,ptVar4)
  ;
  std::__cxx11::string::string((string *)&local_a00,"csa_debug",&local_bc1);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_528,&local_a00,
             &(data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_cs_active_*,_false>._M_head_impl)->print_debug_stuff);
  std::__cxx11::string::string(local_a20,"print debug stuff for cs_active",&local_bc2);
  std::__cxx11::string::_M_assign((string *)(local_528 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (poVar3,(typed_option<bool> *)local_528);
  std::__cxx11::string::~string(local_a20);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_528);
  std::__cxx11::string::~string((string *)&local_a00);
  std::__cxx11::string::~string(local_9e0);
  VW::config::typed_option<float>::~typed_option(&local_488);
  std::__cxx11::string::~string((string *)&local_9c0);
  std::__cxx11::string::~string(local_9a0);
  VW::config::typed_option<float>::~typed_option(&local_3e8);
  std::__cxx11::string::~string((string *)&local_980);
  std::__cxx11::string::~string(local_960);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_348);
  std::__cxx11::string::~string((string *)&local_940);
  std::__cxx11::string::~string(local_920);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_2a8);
  std::__cxx11::string::~string((string *)&local_900);
  std::__cxx11::string::~string(local_8e0);
  VW::config::typed_option<float>::~typed_option(&local_208);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::__cxx11::string::~string(local_8a0);
  VW::config::typed_option<float>::~typed_option(&local_168);
  std::__cxx11::string::~string((string *)&local_880);
  std::__cxx11::string::~string(local_860);
  VW::config::typed_option<int>::~typed_option(&local_c8);
  std::__cxx11::string::~string((string *)&local_840);
  std::__cxx11::string::~string(local_820);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_5c8);
  std::__cxx11::string::~string((string *)&local_800);
  std::__cxx11::string::~string(local_7e0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)&loss_function_type);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::__cxx11::string::~string(local_7a0);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)&__msg);
  std::__cxx11::string::~string((string *)&local_780);
  (**options->_vptr_options_i)(options,&new_options);
  (data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.super__Head_base<0UL,_cs_active_*,_false>.
  _M_head_impl)->use_domination = true;
  std::__cxx11::string::string((string *)&__msg,"domination",(allocator *)&loss_function_type);
  iVar2 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if (((byte)iVar2 & domination == 0) == 1) {
    (data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.super__Head_base<0UL,_cs_active_*,_false>
    ._M_head_impl)->use_domination = false;
  }
  std::__cxx11::string::string((string *)&__msg,"cs_active",(allocator *)&loss_function_type);
  iVar2 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar2 == '\0') {
    plVar8 = (learner<cs_active,_example> *)0x0;
  }
  else {
    (data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.super__Head_base<0UL,_cs_active_*,_false>
    ._M_head_impl)->all = all;
    (data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.super__Head_base<0UL,_cs_active_*,_false>
    ._M_head_impl)->t = 1;
    (**all->loss->_vptr_loss_function)(&loss_function_type);
    bVar1 = std::operator!=(&loss_function_type,"squared");
    if (bVar1) {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<((ostream *)local_b98,"error: you can\'t use non-squared loss with cs_active");
      pvVar9 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar9,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cs_active.cc"
                 ,0x158,&local_6c0);
      __cxa_throw(pvVar9,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::__cxx11::string::string((string *)&__msg,"lda",(allocator *)local_5c8);
    iVar2 = (*options->_vptr_options_i[1])(options,&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    if ((char)iVar2 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<((ostream *)local_b98,"error: you can\'t combine lda and active learning");
      pvVar9 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar9,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cs_active.cc"
                 ,0x15b,&local_6e0);
      __cxa_throw(pvVar9,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::__cxx11::string::string((string *)&__msg,"active",(allocator *)local_5c8);
    iVar2 = (*options->_vptr_options_i[1])(options,&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    if ((char)iVar2 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<((ostream *)local_b98,
                      "error: you can\'t use --cs_active and --active at the same time");
      pvVar9 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar9,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cs_active.cc"
                 ,0x15e,&local_700);
      __cxa_throw(pvVar9,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::__cxx11::string::string((string *)&__msg,"active_cover",(allocator *)local_5c8);
    iVar2 = (*options->_vptr_options_i[1])(options,&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    if ((char)iVar2 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<((ostream *)local_b98,
                      "error: you can\'t use --cs_active and --active_cover at the same time");
      pvVar9 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar9,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cs_active.cc"
                 ,0x161,&local_720);
      __cxa_throw(pvVar9,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::__cxx11::string::string((string *)&__msg,"csoaa",(allocator *)local_5c8);
    iVar2 = (*options->_vptr_options_i[1])(options,&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    if ((char)iVar2 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<((ostream *)local_b98,
                      "error: you can\'t use --cs_active and --csoaa at the same time");
      pvVar9 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar9,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cs_active.cc"
                 ,0x164,&local_740);
      __cxa_throw(pvVar9,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::__cxx11::string::string((string *)&__msg,"adax",(allocator *)local_5c8);
    iVar2 = (*options->_vptr_options_i[1])(options,&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    if ((char)iVar2 == '\0') {
      poVar6 = std::operator<<(&(all->trace_message).super_ostream,
                               "WARNING: --cs_active should be used with --adax");
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    ppuVar12 = &COST_SENSITIVE::cs_label;
    plVar13 = &all->p->lp;
    for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
      plVar13->default_label = (_func_void_void_ptr *)*ppuVar12;
      ppuVar12 = ppuVar12 + (ulong)bVar14 * -2 + 1;
      plVar13 = (label_parser *)((long)plVar13 + (ulong)bVar14 * -0x10 + 8);
    }
    (*all->set_minmax)(all->sd,(data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
                                super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.
                                super__Head_base<0UL,_cs_active_*,_false>._M_head_impl)->cost_max);
    (*all->set_minmax)(all->sd,(data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
                                super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.
                                super__Head_base<0UL,_cs_active_*,_false>._M_head_impl)->cost_min);
    for (uVar11 = 0;
        uVar11 < (data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.
                  super__Head_base<0UL,_cs_active_*,_false>._M_head_impl)->num_classes + 1;
        uVar11 = uVar11 + 1) {
      ___msg = (_func_int **)0x0;
      v_array<unsigned_long>::push_back
                (&(data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
                   super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.
                   super__Head_base<0UL,_cs_active_*,_false>._M_head_impl)->examples_by_queries,
                 (unsigned_long *)&__msg);
    }
    if (simulation == false) {
      pbVar7 = setup_base(options,all);
      base = LEARNER::as_singleline<char,char>(pbVar7);
      predict = predict_or_learn<false,false>;
      learn = predict_or_learn<true,false>;
    }
    else {
      pbVar7 = setup_base(options,all);
      base = LEARNER::as_singleline<char,char>(pbVar7);
      predict = predict_or_learn<false,true>;
      learn = predict_or_learn<true,true>;
    }
    plVar8 = LEARNER::learner<cs_active,example>::init_learner<LEARNER::learner<char,example>>
                       (data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
                        super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.
                        super__Head_base<0UL,_cs_active_*,_false>._M_head_impl,base,learn,predict,
                        (ulong)(data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
                                super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.
                                super__Head_base<0UL,_cs_active_*,_false>._M_head_impl)->num_classes
                        ,multilabels);
    data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.super__Head_base<0UL,_cs_active_*,_false>.
    _M_head_impl = (cs_active *)0x0;
    *(undefined8 *)(plVar8 + 0x58) = *(undefined8 *)(plVar8 + 0x18);
    *(code **)(plVar8 + 0x68) = finish_example;
    *(undefined8 *)(plVar8 + 0xb8) = *(undefined8 *)(plVar8 + 0x18);
    *(undefined8 *)(plVar8 + 0xc0) = *(undefined8 *)(plVar8 + 0x20);
    *(code **)(plVar8 + 200) = finish;
    all->cost_sensitive = (base_learner *)plVar8;
    std::__cxx11::string::~string((string *)&loss_function_type);
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::unique_ptr<cs_active,_void_(*)(void_*)>::~unique_ptr(&data);
  return (base_learner *)plVar8;
}

Assistant:

base_learner* cs_active_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<cs_active>();

  bool simulation = false;
  int domination;
  option_group_definition new_options("Cost-sensitive Active Learning");
  new_options
      .add(make_option("cs_active", data->num_classes).keep().help("Cost-sensitive active learning with <k> costs"))
      .add(make_option("simulation", simulation).help("cost-sensitive active learning simulation mode"))
      .add(make_option("baseline", data->is_baseline).help("cost-sensitive active learning baseline"))
      .add(make_option("domination", domination)
               .default_value(1)
               .help("cost-sensitive active learning use domination. Default 1"))
      .add(make_option("mellowness", data->c0).default_value(0.1f).help("mellowness parameter c_0. Default 0.1."))
      .add(make_option("range_c", data->c1)
               .default_value(0.5f)
               .help("parameter controlling the threshold for per-label cost uncertainty. Default 0.5."))
      .add(make_option("max_labels", data->max_labels).default_value(-1).help("maximum number of label queries."))
      .add(make_option("min_labels", data->min_labels).default_value(-1).help("minimum number of label queries."))
      .add(make_option("cost_max", data->cost_max).default_value(1.f).help("cost upper bound. Default 1."))
      .add(make_option("cost_min", data->cost_min).default_value(0.f).help("cost lower bound. Default 0."))
      // TODO replace with trace and quiet
      .add(make_option("csa_debug", data->print_debug_stuff).help("print debug stuff for cs_active"));
  options.add_and_parse(new_options);

  data->use_domination = true;
  if (options.was_supplied("domination") && !domination)
    data->use_domination = false;

  if (!options.was_supplied("cs_active"))
    return nullptr;

  data->all = &all;
  data->t = 1;

  auto loss_function_type = all.loss->getType();
  if (loss_function_type != "squared")
    THROW("error: you can't use non-squared loss with cs_active");

  if (options.was_supplied("lda"))
    THROW("error: you can't combine lda and active learning");

  if (options.was_supplied("active"))
    THROW("error: you can't use --cs_active and --active at the same time");

  if (options.was_supplied("active_cover"))
    THROW("error: you can't use --cs_active and --active_cover at the same time");

  if (options.was_supplied("csoaa"))
    THROW("error: you can't use --cs_active and --csoaa at the same time");

  if (!options.was_supplied("adax"))
    all.trace_message << "WARNING: --cs_active should be used with --adax" << endl;

  all.p->lp = cs_label;  // assigning the label parser
  all.set_minmax(all.sd, data->cost_max);
  all.set_minmax(all.sd, data->cost_min);
  for (uint32_t i = 0; i < data->num_classes + 1; i++) data->examples_by_queries.push_back(0);

  learner<cs_active, example>& l = simulation
      ? init_learner(data, as_singleline(setup_base(options, all)), predict_or_learn<true, true>,
            predict_or_learn<false, true>, data->num_classes, prediction_type::multilabels)
      : init_learner(data, as_singleline(setup_base(options, all)), predict_or_learn<true, false>,
            predict_or_learn<false, false>, data->num_classes, prediction_type::multilabels);

  l.set_finish_example(finish_example);
  l.set_finish(finish);
  base_learner* b = make_base(l);
  all.cost_sensitive = b;
  return b;
}